

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O3

void I422ToARGBRow_C(uint8_t *src_y,uint8_t *src_u,uint8_t *src_v,uint8_t *rgb_buf,
                    YuvConstants *yuvconstants,int width)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  short sVar6;
  short sVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  uint8_t uVar12;
  byte *local_48;
  
  local_48 = src_y;
  if (1 < width) {
    lVar8 = 0;
    do {
      bVar1 = *src_u;
      uVar9 = (int)yuvconstants->kYToRgb[0] * (uint)src_y[lVar8] * 0x101 >> 0x10;
      iVar11 = ((int)yuvconstants->kUVBiasB[0] - (int)yuvconstants->kUVToB[0] * (uint)bVar1) + uVar9
      ;
      if (iVar11 >> 6 < 1) {
        iVar11 = 0;
      }
      iVar11 = iVar11 >> 6;
      if (0xfe < iVar11) {
        iVar11 = 0xff;
      }
      bVar2 = *src_v;
      cVar3 = yuvconstants->kUVToG[0];
      cVar4 = yuvconstants->kUVToG[1];
      cVar5 = yuvconstants->kUVToR[1];
      sVar6 = yuvconstants->kUVBiasG[0];
      sVar7 = yuvconstants->kUVBiasR[0];
      *rgb_buf = (uint8_t)iVar11;
      iVar11 = ((int)sVar6 - ((int)cVar4 * (uint)bVar2 + (int)cVar3 * (uint)bVar1)) + uVar9;
      if (iVar11 >> 6 < 1) {
        iVar11 = 0;
      }
      iVar11 = iVar11 >> 6;
      if (0xfe < iVar11) {
        iVar11 = 0xff;
      }
      rgb_buf[1] = (uint8_t)iVar11;
      iVar11 = ((int)sVar7 - (int)cVar5 * (uint)bVar2) + uVar9;
      if (iVar11 >> 6 < 1) {
        iVar11 = 0;
      }
      iVar11 = iVar11 >> 6;
      if (0xfe < iVar11) {
        iVar11 = 0xff;
      }
      rgb_buf[2] = (uint8_t)iVar11;
      rgb_buf[3] = 0xff;
      bVar1 = *src_u;
      bVar2 = *src_v;
      cVar3 = yuvconstants->kUVToG[0];
      cVar4 = yuvconstants->kUVToG[1];
      cVar5 = yuvconstants->kUVToR[1];
      sVar6 = yuvconstants->kUVBiasG[0];
      sVar7 = yuvconstants->kUVBiasR[0];
      uVar9 = (int)yuvconstants->kYToRgb[0] * (uint)src_y[lVar8 + 1] * 0x101 >> 0x10;
      iVar11 = ((int)yuvconstants->kUVBiasB[0] - (int)yuvconstants->kUVToB[0] * (uint)bVar1) + uVar9
      ;
      if (iVar11 >> 6 < 1) {
        iVar11 = 0;
      }
      iVar11 = iVar11 >> 6;
      if (0xfe < iVar11) {
        iVar11 = 0xff;
      }
      rgb_buf[4] = (uint8_t)iVar11;
      iVar11 = ((int)sVar6 - ((int)cVar4 * (uint)bVar2 + (int)cVar3 * (uint)bVar1)) + uVar9;
      if (iVar11 >> 6 < 1) {
        iVar11 = 0;
      }
      iVar11 = iVar11 >> 6;
      if (0xfe < iVar11) {
        iVar11 = 0xff;
      }
      rgb_buf[5] = (uint8_t)iVar11;
      iVar11 = ((int)sVar7 - (int)cVar5 * (uint)bVar2) + uVar9;
      if (iVar11 >> 6 < 1) {
        iVar11 = 0;
      }
      iVar11 = iVar11 >> 6;
      if (0xfe < iVar11) {
        iVar11 = 0xff;
      }
      rgb_buf[6] = (uint8_t)iVar11;
      rgb_buf[7] = 0xff;
      src_u = src_u + 1;
      src_v = src_v + 1;
      rgb_buf = rgb_buf + 8;
      lVar8 = lVar8 + 2;
    } while ((int)lVar8 < width + -1);
    local_48 = src_y + lVar8;
  }
  if ((width & 1U) != 0) {
    bVar1 = *src_u;
    bVar2 = *src_v;
    cVar3 = yuvconstants->kUVToG[0];
    cVar4 = yuvconstants->kUVToG[1];
    cVar5 = yuvconstants->kUVToR[1];
    sVar6 = yuvconstants->kUVBiasG[0];
    sVar7 = yuvconstants->kUVBiasR[0];
    uVar9 = (int)yuvconstants->kYToRgb[0] * (uint)*local_48 * 0x101 >> 0x10;
    iVar11 = (int)(((int)yuvconstants->kUVBiasB[0] - (int)yuvconstants->kUVToB[0] * (uint)bVar1) +
                  uVar9) >> 6;
    iVar10 = 0;
    if (iVar11 < 1) {
      iVar11 = iVar10;
    }
    uVar12 = (uint8_t)iVar11;
    if (0xfe < iVar11) {
      uVar12 = 0xff;
    }
    *rgb_buf = uVar12;
    iVar11 = (int)(((int)sVar6 - ((int)cVar4 * (uint)bVar2 + (int)cVar3 * (uint)bVar1)) + uVar9) >>
             6;
    if (iVar11 < 1) {
      iVar11 = iVar10;
    }
    uVar12 = (uint8_t)iVar11;
    if (0xfe < iVar11) {
      uVar12 = 0xff;
    }
    rgb_buf[1] = uVar12;
    iVar11 = (int)(((int)sVar7 - (int)cVar5 * (uint)bVar2) + uVar9) >> 6;
    if (iVar11 < 1) {
      iVar11 = iVar10;
    }
    uVar12 = (uint8_t)iVar11;
    if (0xfe < iVar11) {
      uVar12 = 0xff;
    }
    rgb_buf[2] = uVar12;
    rgb_buf[3] = 0xff;
  }
  return;
}

Assistant:

void I422ToARGBRow_C(const uint8_t* src_y,
                     const uint8_t* src_u,
                     const uint8_t* src_v,
                     uint8_t* rgb_buf,
                     const struct YuvConstants* yuvconstants,
                     int width) {
  int x;
  for (x = 0; x < width - 1; x += 2) {
    YuvPixel(src_y[0], src_u[0], src_v[0], rgb_buf + 0, rgb_buf + 1,
             rgb_buf + 2, yuvconstants);
    rgb_buf[3] = 255;
    YuvPixel(src_y[1], src_u[0], src_v[0], rgb_buf + 4, rgb_buf + 5,
             rgb_buf + 6, yuvconstants);
    rgb_buf[7] = 255;
    src_y += 2;
    src_u += 1;
    src_v += 1;
    rgb_buf += 8;  // Advance 2 pixels.
  }
  if (width & 1) {
    YuvPixel(src_y[0], src_u[0], src_v[0], rgb_buf + 0, rgb_buf + 1,
             rgb_buf + 2, yuvconstants);
    rgb_buf[3] = 255;
  }
}